

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O1

void rgbcx::prepare_bc1_single_color_table_half
               (bc1_match_entry *pTable,uint8_t *pExpand,int size,bc1_approx_mode mode)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  bc1_match_entry *pbVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  
  lVar14 = 0;
  do {
    if (0 < size) {
      pbVar8 = pTable + lVar14;
      iVar9 = 0x100;
      uVar6 = 0;
      uVar10 = 0;
      do {
        bVar1 = pExpand[uVar10];
        uVar13 = (uint)bVar1;
        uVar11 = 0;
        uVar7 = uVar6;
        do {
          bVar2 = pExpand[uVar11];
          if (size == 0x20) {
            if (mode == cBC1AMD) {
LAB_0011864c:
              uVar4 = bVar1 + 1 + (uint)bVar2;
            }
            else {
              if (mode == cBC1NVidia) {
                uVar4 = (uint)(uVar7 >> 3);
                goto LAB_0011865d;
              }
LAB_00118657:
              uVar4 = uVar13 + bVar2;
            }
            uVar4 = uVar4 >> 1;
          }
          else {
            if (mode == cBC1AMD) goto LAB_0011864c;
            if (mode != cBC1NVidia) goto LAB_00118657;
            iVar5 = uVar13 - bVar2;
            iVar3 = iVar5 + 3;
            if (-1 < iVar5) {
              iVar3 = iVar5;
            }
            iVar3 = (iVar3 >> 2) + (uint)bVar2 * 0x100;
            iVar12 = iVar5 * 0x80 + iVar3 + 0x80;
            iVar3 = iVar5 * 0x80 + 0x17f + iVar3;
            if (-1 < iVar12) {
              iVar3 = iVar12;
            }
            uVar4 = iVar3 >> 8;
          }
LAB_0011865d:
          iVar5 = uVar4 - (int)lVar14;
          iVar3 = -iVar5;
          if (0 < iVar5) {
            iVar3 = iVar5;
          }
          if ((mode == cBC1IdealRound4) || (mode == cBC1Ideal)) {
            iVar12 = bVar2 - uVar13;
            iVar5 = -iVar12;
            if (0 < iVar12) {
              iVar5 = iVar12;
            }
            iVar3 = iVar3 + (int)((ulong)(uint)(iVar5 * 3) * 0x28f5c29 >> 0x20);
          }
          if ((iVar3 < iVar9) || ((uVar10 == uVar11 && (iVar3 == iVar9)))) {
            pbVar8->m_hi = (uint8_t)uVar11;
            pbVar8->m_lo = (uint8_t)uVar10;
            pbVar8->m_e = (uint8_t)iVar3;
            iVar9 = iVar3;
          }
          uVar11 = uVar11 + 1;
          uVar7 = (ulong)((int)uVar7 + 0x21);
        } while ((uint)size != uVar11);
        uVar10 = uVar10 + 1;
        uVar6 = (ulong)((int)uVar6 + 0x21);
      } while (uVar10 != (uint)size);
    }
    lVar14 = lVar14 + 1;
    if (lVar14 == 0x100) {
      return;
    }
  } while( true );
}

Assistant:

static void prepare_bc1_single_color_table_half(bc1_match_entry* pTable, const uint8_t* pExpand, int size, bc1_approx_mode mode)
	{
		for (int i = 0; i < 256; i++)
		{
			int lowest_e = 256;
			for (int lo = 0; lo < size; lo++)
			{
				const int lo_e = pExpand[lo];

				for (int hi = 0; hi < size; hi++)
				{
					const int hi_e = pExpand[hi];
										
					const int v = (size == 32) ? interp_half_5(hi, lo, hi_e, lo_e, mode) : interp_half_6(hi, lo, hi_e, lo_e, mode);
											
					int e = iabs(v - i);

					// We only need to factor in 3% error in BC1 ideal mode.
					if ((mode == bc1_approx_mode::cBC1Ideal) || (mode == bc1_approx_mode::cBC1IdealRound4))
						e += (iabs(hi_e - lo_e) * 3) / 100;

					// Favor equal endpoints, for lower error on actual GPU's which approximate the interpolation.
					if ((e < lowest_e) || ((e == lowest_e) && (lo == hi)))
					{
						pTable[i].m_hi = static_cast<uint8_t>(hi);
						pTable[i].m_lo = static_cast<uint8_t>(lo);
						
						assert(e <= UINT8_MAX);
						pTable[i].m_e = static_cast<uint8_t>(e);

						lowest_e = e;
					}

				} // hi
			} // lo
		}
	}